

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

MemoryStream * __thiscall Assimp::Ogre::VertexData::VertexBuffer(VertexData *this,uint16_t source)

{
  iterator iVar1;
  mapped_type *pmVar2;
  element_type *peVar3;
  key_type_conflict local_12;
  
  iVar1 = std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
          ::find(&(this->vertexBindings)._M_t,&local_12);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->vertexBindings)._M_t._M_impl.super__Rb_tree_header
     ) {
    peVar3 = (MemoryStream *)0x0;
  }
  else {
    pmVar2 = std::
             map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
             ::operator[](&this->vertexBindings,&local_12);
    peVar3 = (pmVar2->super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
  }
  return peVar3;
}

Assistant:

MemoryStream *VertexData::VertexBuffer(uint16_t source)
{
    if (vertexBindings.find(source) != vertexBindings.end())
        return vertexBindings[source].get();
    return 0;
}